

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_copy.cpp
# Opt level: O0

void duckdb::TemplatedCopy<unsigned_short>
               (Vector *source,SelectionVector *sel,Vector *target,idx_t source_offset,
               idx_t target_offset,idx_t copy_count)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  idx_t iVar3;
  long in_RCX;
  SelectionVector *in_RSI;
  long in_R8;
  ulong in_R9;
  idx_t source_idx;
  idx_t i;
  unsigned_short *tdata;
  unsigned_short *ldata;
  ulong local_48;
  
  puVar1 = FlatVector::GetData<unsigned_short>((Vector *)0x5384dc);
  puVar2 = FlatVector::GetData<unsigned_short>((Vector *)0x5384eb);
  for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
    iVar3 = SelectionVector::get_index(in_RSI,in_RCX + local_48);
    puVar2[in_R8 + local_48] = puVar1[iVar3];
  }
  return;
}

Assistant:

static void TemplatedCopy(const Vector &source, const SelectionVector &sel, Vector &target, idx_t source_offset,
                          idx_t target_offset, idx_t copy_count) {
	auto ldata = FlatVector::GetData<T>(source);
	auto tdata = FlatVector::GetData<T>(target);
	for (idx_t i = 0; i < copy_count; i++) {
		auto source_idx = sel.get_index(source_offset + i);
		tdata[target_offset + i] = ldata[source_idx];
	}
}